

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

int check_evasion(CHAR_DATA *ch,int chance)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OBJ_DATA *pOVar5;
  OBJ_DATA *pOVar6;
  int in_ESI;
  CHAR_DATA *in_RDI;
  CHAR_DATA *unaff_retaddr;
  OBJ_DATA *dual;
  OBJ_DATA *weapon;
  float nododge;
  int dex;
  int skill;
  int in_stack_000000a4;
  bool in_stack_000000ab;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_fffffffffffffffc;
  
  pOVar5 = get_eq_char(in_RDI,0x10);
  pOVar6 = get_eq_char(in_RDI,0x12);
  iVar1 = get_skill(in_stack_000000d0,in_stack_000000cc);
  if ((1 < iVar1) && (iVar2 = get_curr_stat(unaff_retaddr,in_stack_fffffffffffffffc), 0x12 < iVar2))
  {
    if (pOVar5 != (OBJ_DATA *)0x0) {
      in_stack_ffffffffffffffcc = (int)pOVar5->weight;
      iVar3 = skirmisher_max_weapweight
                        ((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
      ;
      if (iVar3 < in_stack_ffffffffffffffcc) {
        return in_ESI;
      }
    }
    if (pOVar6 != (OBJ_DATA *)0x0) {
      iVar3 = (int)pOVar6->weight;
      iVar4 = skirmisher_max_weapweight((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffcc,iVar3));
      if (iVar4 < iVar3) {
        return in_ESI;
      }
    }
    iVar3 = number_percent();
    if (iVar3 <= iVar1) {
      check_improve(in_stack_000000b0,in_stack_000000ac,in_stack_000000ab,in_stack_000000a4);
      in_ESI = 100 - (int)((float)(100 - in_ESI) * ((float)(iVar2 + -0x12) * -0.05 + 1.0));
      if (2 < in_RDI->size) {
        in_ESI = in_ESI + (in_RDI->size + -2) * -10;
      }
    }
  }
  return in_ESI;
}

Assistant:

int check_evasion(CHAR_DATA *ch, int chance)
{
	int skill, dex;
	float nododge = 100 - chance; // chance of NOT dodging
	OBJ_DATA *weapon, *dual;

	weapon = get_eq_char(ch, WEAR_WIELD);
	dual = get_eq_char(ch, WEAR_DUAL_WIELD);

	skill = get_skill(ch, gsn_evasion);

	if (skill <= 1)
		return chance;

	dex = get_curr_stat(ch, STAT_DEX);

	if (dex <= 18)
		return chance;

	if (weapon != nullptr)
	{
		if (weapon->weight > skirmisher_max_weapweight(ch))
			return chance;
	}

	if (dual != nullptr)
	{
		if (dual->weight > skirmisher_max_weapweight(ch))
			return chance;
	}

	if (number_percent() > skill)
	{
		return chance;
	}
	else
	{
		nododge *= ((float)1 - 0.05 * (float)(dex - 18));
		check_improve(ch, gsn_evasion, true, 5);
		chance = 100 - (int)nododge;

		if (ch->size > SIZE_MEDIUM)
			chance -= (ch->size - SIZE_MEDIUM) * 10;
	}

	return chance;
}